

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O3

void __thiscall jaegertracing::thrift::SpanRef::write(SpanRef *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write((SpanRef *)(&this->field_0x0 + *(long *)(*(long *)this + -0x28)),in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

uint32_t SpanRef::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("SpanRef");

  xfer += oprot->writeFieldBegin("refType", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32((int32_t)this->refType);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("traceIdLow", ::apache::thrift::protocol::T_I64, 2);
  xfer += oprot->writeI64(this->traceIdLow);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("traceIdHigh", ::apache::thrift::protocol::T_I64, 3);
  xfer += oprot->writeI64(this->traceIdHigh);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("spanId", ::apache::thrift::protocol::T_I64, 4);
  xfer += oprot->writeI64(this->spanId);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}